

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2d.cpp
# Opt level: O1

int main(void)

{
  array<int,_9UL> *__s;
  long *plVar1;
  pointer *__ptr;
  uint uVar2;
  _Head_base<0UL,_std::array<int,_9UL>_*,_false> _Var3;
  pair<const_int_*,_const_int_*> pVar4;
  Matrix<int,_3UL,_3UL> kernel;
  Matrix<int,_6UL,_6UL> matrix;
  Matrix<int,_4UL,_4UL> hourglasses;
  istream_iterator<int,_char,_std::char_traits<char>,_long> reader;
  Matrix<int,_3UL,_3UL> local_48;
  _Head_base<0UL,_std::array<int,_9UL>_*,_false> local_40;
  istream_iterator<int,_char,_std::char_traits<char>,_long> local_38;
  istream_iterator<int,_char,_std::char_traits<char>,_long> local_28;
  
  __s = (array<int,_9UL> *)operator_new(0x90);
  memset(__s,0,0x90);
  local_40._M_head_impl = __s;
  local_48.elements._M_t.
  super___uniq_ptr_impl<std::array<int,_9UL>,_std::default_delete<std::array<int,_9UL>_>_>._M_t.
  super__Tuple_impl<0UL,_std::array<int,_9UL>_*,_std::default_delete<std::array<int,_9UL>_>_>.
  super__Head_base<0UL,_std::array<int,_9UL>_*,_false>._M_head_impl =
       (unique_ptr<std::array<int,_9UL>,_std::default_delete<std::array<int,_9UL>_>_>)
       operator_new(0x24);
  *(undefined8 *)
   ((long)local_48.elements._M_t.
          super___uniq_ptr_impl<std::array<int,_9UL>,_std::default_delete<std::array<int,_9UL>_>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::array<int,_9UL>_*,_std::default_delete<std::array<int,_9UL>_>_>
          .super__Head_base<0UL,_std::array<int,_9UL>_*,_false>._M_head_impl + 0x10) = 1;
  *(undefined8 *)
   ((long)local_48.elements._M_t.
          super___uniq_ptr_impl<std::array<int,_9UL>,_std::default_delete<std::array<int,_9UL>_>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::array<int,_9UL>_*,_std::default_delete<std::array<int,_9UL>_>_>
          .super__Head_base<0UL,_std::array<int,_9UL>_*,_false>._M_head_impl + 0x18) = 0x100000001;
  *(undefined8 *)
   local_48.elements._M_t.
   super___uniq_ptr_impl<std::array<int,_9UL>,_std::default_delete<std::array<int,_9UL>_>_>._M_t.
   super__Tuple_impl<0UL,_std::array<int,_9UL>_*,_std::default_delete<std::array<int,_9UL>_>_>.
   super__Head_base<0UL,_std::array<int,_9UL>_*,_false>._M_head_impl = 0x100000001;
  *(undefined8 *)
   ((long)local_48.elements._M_t.
          super___uniq_ptr_impl<std::array<int,_9UL>,_std::default_delete<std::array<int,_9UL>_>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::array<int,_9UL>_*,_std::default_delete<std::array<int,_9UL>_>_>
          .super__Head_base<0UL,_std::array<int,_9UL>_*,_false>._M_head_impl + 8) = 1;
  *(undefined4 *)
   ((long)local_48.elements._M_t.
          super___uniq_ptr_impl<std::array<int,_9UL>,_std::default_delete<std::array<int,_9UL>_>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::array<int,_9UL>_*,_std::default_delete<std::array<int,_9UL>_>_>
          .super__Head_base<0UL,_std::array<int,_9UL>_*,_false>._M_head_impl + 0x20) = 1;
  local_28._M_stream = (istream_type *)&std::cin;
  local_28._M_ok = true;
  std::istream_iterator<int,_char,_std::char_traits<char>,_long>::_M_read(&local_28);
  local_38._M_stream = local_28._M_stream;
  local_38._M_value = local_28._M_value;
  local_38._M_ok = local_28._M_ok;
  (local_40._M_head_impl)->_M_elems[0] = local_28._M_value;
  uVar2 = 0x25;
  _Var3._M_head_impl = local_40._M_head_impl;
  do {
    _Var3._M_head_impl = (array<int,_9UL> *)((long)_Var3._M_head_impl + 4);
    std::istream_iterator<int,_char,_std::char_traits<char>,_long>::_M_read(&local_38);
    *(int *)_Var3._M_head_impl = local_38._M_value;
    uVar2 = uVar2 - 1;
  } while (2 < uVar2);
  Matrix<int,6ul,6ul>::conv<3ul,3ul>
            ((Matrix<int,6ul,6ul> *)&local_38,(Matrix<int,_3UL,_3UL> *)&local_40);
  Matrix<int,_6UL,_6UL>::dump((Matrix<int,_6UL,_6UL> *)&local_40,(ostream *)&std::cout);
  Matrix<int,_3UL,_3UL>::dump(&local_48,(ostream *)&std::cout);
  Matrix<int,_4UL,_4UL>::dump((Matrix<int,_4UL,_4UL> *)&local_38,(ostream *)&std::cout);
  pVar4 = std::__minmax_element<int_const*,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_38._M_stream,local_38._M_stream + 0x40);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,*pVar4.second);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  if (local_38._M_stream != (istream_type *)0x0) {
    operator_delete(local_38._M_stream,0x40);
  }
  if (local_48.elements._M_t.
      super___uniq_ptr_impl<std::array<int,_9UL>,_std::default_delete<std::array<int,_9UL>_>_>._M_t.
      super__Tuple_impl<0UL,_std::array<int,_9UL>_*,_std::default_delete<std::array<int,_9UL>_>_>.
      super__Head_base<0UL,_std::array<int,_9UL>_*,_false>._M_head_impl !=
      (__uniq_ptr_data<std::array<int,_9UL>,_std::default_delete<std::array<int,_9UL>_>,_true,_true>
      )0x0) {
    operator_delete((void *)local_48.elements._M_t.
                            super___uniq_ptr_impl<std::array<int,_9UL>,_std::default_delete<std::array<int,_9UL>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::array<int,_9UL>_*,_std::default_delete<std::array<int,_9UL>_>_>
                            .super__Head_base<0UL,_std::array<int,_9UL>_*,_false>._M_head_impl,0x24)
    ;
  }
  if (local_40._M_head_impl != (array<int,_9UL> *)0x0) {
    operator_delete(local_40._M_head_impl,0x90);
  }
  return 0;
}

Assistant:

int main() {
  Matrix<int, 6, 6> matrix{};
  Matrix<int, 3, 3> kernel{1, 1, 1, 0, 1, 0, 1, 1, 1};
  auto reader = std::istream_iterator<int>(std::cin);
  std::copy_n(reader, 36, matrix.begin());
  auto hourglasses = matrix.conv(kernel);
  #ifndef NDEBUG
  matrix.dump(std::cout);
  kernel.dump(std::cout);
  hourglasses.dump(std::cout);
  #endif
  const int max_hourglass_value = *std::minmax_element(hourglasses.cbegin(), hourglasses.cend()).second;
  std::cout << max_hourglass_value << std::endl;
  return 0;
}